

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.h
# Opt level: O1

void __thiscall CTextCursor::Reset(CTextCursor *this,int64 StringVersion)

{
  bool bVar1;
  
  if ((StringVersion < 0) || (bVar1 = true, this->m_StringVersion != StringVersion)) {
    this->m_Width = 0.0;
    this->m_Height = 0.0;
    this->m_NextLineAdvanceY = 0.0;
    (this->m_Advance).field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
    (this->m_Advance).field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
    this->m_LineCount = 1;
    this->m_CharCount = 0;
    this->m_PageCountWhenDrawn = -1;
    this->m_Truncated = false;
    this->m_StartOfLine = true;
    if ((this->m_Glyphs).list_size < 0) {
      array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::alloc(&this->m_Glyphs,0);
    }
    (this->m_Glyphs).num_elements = 0;
    this->m_StringVersion = StringVersion;
    bVar1 = false;
  }
  this->m_SkipTextRender = bVar1;
  return;
}

Assistant:

void Reset(int64 StringVersion = -1)
	{
		if (StringVersion < 0 || m_StringVersion != StringVersion)
		{
			m_Width = 0;
			m_Height = 0;
			m_NextLineAdvanceY = 0;
			m_Advance = vec2(0, 0);
			m_LineCount = 1;
			m_CharCount = 0;
			m_PageCountWhenDrawn = -1;
			m_Truncated = false;
			m_StartOfLine = true;
			m_Glyphs.set_size(0);
			m_StringVersion = StringVersion;
			m_SkipTextRender = false;
		}
		else
		{
			m_SkipTextRender = true;
		}
	}